

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall RegisterRequest::RegisterRequest(RegisterRequest *this,Event *e)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  bool bVar1;
  EventNotValid *this_00;
  string *local_258;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1a0 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_180 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_160 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_140 [2];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [34];
  undefined1 local_f6;
  allocator local_f5;
  allocator local_f4;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  string *local_f0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  iterator local_48;
  undefined8 local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  Event *local_18;
  Event *e_local;
  RegisterRequest *this_local;
  
  local_18 = e;
  e_local = (Event *)this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->password);
  std::__cxx11::string::string((string *)&this->alias);
  std::__cxx11::string::string((string *)&this->bio);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_28,e);
  local_f6 = 1;
  local_f0 = local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"type",&local_f1);
  local_f0 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"username",&local_f2);
  local_f0 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"password",&local_f3);
  local_f0 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"alias",&local_f4);
  local_f0 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"bio",&local_f5);
  local_f6 = 0;
  local_48 = (iterator)local_e8;
  local_40 = 5;
  keysToBeInEvent._M_len = 5;
  keysToBeInEvent._M_array = local_48;
  bVar1 = checkEventKeys(&local_28,keysToBeInEvent);
  local_258 = (string *)&local_48;
  do {
    local_258 = local_258 + -0x20;
    std::__cxx11::string::~string(local_258);
  } while (local_258 != local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f5);
  std::allocator<char>::~allocator((allocator<char> *)&local_f4);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3);
  std::allocator<char>::~allocator((allocator<char> *)&local_f2);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)e,"username");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_140);
    std::__cxx11::string::operator=((string *)this,(string *)local_140);
    std::__cxx11::string::~string((string *)local_140);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)e,"password");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_160);
    std::__cxx11::string::operator=((string *)&this->password,(string *)local_160);
    std::__cxx11::string::~string((string *)local_160);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)e,"alias");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_180);
    std::__cxx11::string::operator=((string *)&this->alias,(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)e,"bio");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_1a0);
    std::__cxx11::string::operator=((string *)&this->bio,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    return;
  }
  local_11a = 1;
  this_00 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"Improper REGISTER_REQUEST",&local_119);
  EventNotValid::EventNotValid(this_00,(string *)local_118);
  local_11a = 0;
  __cxa_throw(this_00,&EventNotValid::typeinfo,EventNotValid::~EventNotValid);
}

Assistant:

explicit RegisterRequest(Event e){
	  if(!checkEventKeys(e, {"type", "username", "password", "alias", "bio"})) {
		  throw EventNotValid("Improper REGISTER_REQUEST");
	  }
	  try{
		  username = e["username"].get<std::string>();
		  password = e["password"].get<std::string>();
		  alias = e["alias"].get<std::string>();
		  bio = e["bio"].get<std::string>();
	  }
	  catch(...){
		  throw EventNotValid("Improper REGISTER_REQUEST");
	  }
  }